

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxSoundCast::FxSoundCast(FxSoundCast *this,FxExpression *x)

{
  FxExpression *x_local;
  FxSoundCast *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_SoundCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxSoundCast_00a09e30;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeSound;
  return;
}

Assistant:

FxSoundCast::FxSoundCast(FxExpression *x)
	: FxExpression(EFX_SoundCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeSound;
}